

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

int * Gia_PermuteSpecialOrder(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  bool bVar3;
  int *pOrder;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPerm;
  Gia_Man_t *p_local;
  
  Gia_ManCreateRefs(p);
  iVar1 = Gia_ManPiNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  pOrder._4_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar3 = false;
    if (pOrder._4_4_ < iVar1) {
      pGStack_20 = Gia_ManCi(p,pOrder._4_4_);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjRefNum(p,pGStack_20);
    Vec_IntPush(p_00,iVar1);
    pOrder._4_4_ = pOrder._4_4_ + 1;
  }
  piVar2 = Vec_IntArray(p_00);
  iVar1 = Vec_IntSize(p_00);
  piVar2 = Abc_QuickSortCost(piVar2,iVar1,1);
  Vec_IntFree(p_00);
  return piVar2;
}

Assistant:

int * Gia_PermuteSpecialOrder( Gia_Man_t * p )
{
    Vec_Int_t * vPerm;
    Gia_Obj_t * pObj;
    int i, * pOrder;
    Gia_ManCreateRefs( p );
    vPerm = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPerm, Gia_ObjRefNum(p, pObj) );
    pOrder = Abc_QuickSortCost( Vec_IntArray(vPerm), Vec_IntSize(vPerm), 1 );
    Vec_IntFree( vPerm );
    return pOrder;
}